

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnReturnCallExpr
          (BinaryReaderInterp *this,Index func_index)

{
  pointer pFVar1;
  long lVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  Istream *this_00;
  pointer pFVar6;
  Index IVar7;
  Result RVar8;
  Offset offset;
  uint uVar9;
  uint uVar10;
  u32 val;
  int iVar11;
  Enum EVar12;
  Location local_98;
  Var local_78;
  
  pFVar1 = (this->func_types_).
           super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar2 = *(long *)&pFVar1[func_index].params.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl;
  pTVar3 = *(pointer *)
            ((long)&pFVar1[func_index].params.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl + 8);
  pTVar4 = (this->validator_).typechecker_.type_stack_.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar5 = (this->validator_).typechecker_.type_stack_.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  IVar7 = SharedValidator::GetLocalCount(&this->validator_);
  local_98.field_1.field_0.line = 0;
  local_98.field_1._4_8_ = 0;
  local_98.filename.data_ = (char *)0x0;
  local_98.filename.size_._0_4_ = 0;
  local_98.filename.size_._4_4_ = 0;
  Var::Var(&local_78,func_index,&local_98);
  RVar8 = SharedValidator::OnReturnCall
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_78);
  Var::~Var(&local_78);
  EVar12 = Error;
  if (RVar8.enum_ != Error) {
    EVar12 = Ok;
    uVar9 = (uint)((ulong)((long)pTVar5 - (long)pTVar4) >> 2);
    uVar10 = (uint)((ulong)((long)pTVar3 - lVar2) >> 2);
    iVar11 = uVar9 - uVar10;
    if (uVar9 < uVar10) {
      iVar11 = 0;
    }
    Istream::EmitDropKeep(this->istream_,iVar11 + IVar7,uVar10);
    this_00 = this->istream_;
    pFVar6 = (this->module_->funcs).
             super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar10 = (int)((ulong)((long)(this->func_types_).
                                 super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->func_types_).
                                super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 6) +
             (int)((ulong)((long)(this->module_->funcs).
                                 super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar6) >> 5) *
             0x55555555;
    uVar9 = func_index - uVar10;
    if (func_index < uVar10) {
      Istream::Emit(this_00,InterpCallImport,func_index);
      Istream::Emit(this->istream_,Return);
    }
    else {
      val = pFVar6[uVar9].code_offset;
      if (val == 0xffffffff) {
        offset = Istream::end(this_00);
        FixupMap::Append(&this->func_fixups_,func_index,offset);
        val = pFVar6[uVar9].code_offset;
      }
      Istream::Emit(this_00,Br,val);
      EVar12 = Ok;
    }
  }
  return (Result)EVar12;
}

Assistant:

Result BinaryReaderInterp::OnReturnCallExpr(Index func_index) {
  FuncType& func_type = func_types_[func_index];

  Index drop_count, keep_count;
  CHECK_RESULT(
      GetReturnCallDropKeepCount(func_type, 0, &drop_count, &keep_count));
  // The validator must be run after we get the drop/keep counts, since it
  // will change the type stack.
  CHECK_RESULT(validator_.OnReturnCall(loc, Var(func_index)));
  istream_.EmitDropKeep(drop_count, keep_count);

  if (func_index >= num_func_imports()) {
    istream_.Emit(Opcode::Br, GetFuncOffset(func_index));
  } else {
    istream_.Emit(Opcode::InterpCallImport, func_index);
    istream_.Emit(Opcode::Return);
  }

  return Result::Ok;
}